

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O2

void __thiscall
leveldb::CorruptionTest_TableFileRepair_Test::TestBody(CorruptionTest_TableFileRepair_Test *this)

{
  DBImpl *this_00;
  
  (this->super_CorruptionTest).options_.block_size = 2000;
  (this->super_CorruptionTest).options_.paranoid_checks = true;
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  CorruptionTest::Build(&this->super_CorruptionTest,100);
  this_00 = (DBImpl *)(this->super_CorruptionTest).db_;
  DBImpl::TEST_CompactMemTable((DBImpl *)&stack0xffffffffffffffd8);
  Status::~Status((Status *)&stack0xffffffffffffffd8);
  DBImpl::TEST_CompactRange(this_00,0,(Slice *)0x0,(Slice *)0x0);
  DBImpl::TEST_CompactRange(this_00,1,(Slice *)0x0,(Slice *)0x0);
  CorruptionTest::Corrupt(&this->super_CorruptionTest,kTableFile,100,1);
  CorruptionTest::RepairDB(&this->super_CorruptionTest);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  CorruptionTest::Check(&this->super_CorruptionTest,0x5f,99);
  return;
}

Assistant:

TEST_F(CorruptionTest, TableFileRepair) {
  options_.block_size = 2 * kValueSize;  // Limit scope of corruption
  options_.paranoid_checks = true;
  Reopen();
  Build(100);
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();
  dbi->TEST_CompactRange(0, nullptr, nullptr);
  dbi->TEST_CompactRange(1, nullptr, nullptr);

  Corrupt(kTableFile, 100, 1);
  RepairDB();
  Reopen();
  Check(95, 99);
}